

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

AnonymousProgramSymbol *
slang::ast::AnonymousProgramSymbol::fromSyntax(Scope *scope,AnonymousProgramSyntax *syntax)

{
  bool bVar1;
  Compilation *this;
  Symbol *this_00;
  SyntaxNode *in_RSI;
  Symbol *in_RDI;
  Symbol *member_1;
  MemberSyntax *member;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  AnonymousProgramSymbol *result;
  Compilation *comp;
  SyntaxNode *in_stack_000005f8;
  Scope *in_stack_00000600;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *in_stack_ffffffffffffff98;
  Symbol *symbol;
  Compilation *args;
  BumpAllocator *in_stack_ffffffffffffffb0;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  local_38;
  SyntaxNode **local_30;
  SourceLocation local_28;
  AnonymousProgramSymbol *local_20;
  Compilation *local_18;
  SyntaxNode *local_10;
  Symbol *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  this = Scope::getCompilation((Scope *)in_RDI);
  args = this;
  local_18 = this;
  local_28 = parsing::Token::location((Token *)&local_10[3].parent);
  local_20 = BumpAllocator::
             emplace<slang::ast::AnonymousProgramSymbol,slang::ast::Compilation&,slang::SourceLocation>
                       (in_stack_ffffffffffffffb0,args,(SourceLocation *)this);
  Symbol::setSyntax(&local_20->super_Symbol,local_10);
  local_30 = &local_10[4].previewNode;
  local_38._M_current =
       (MemberSyntax **)
       std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                 (in_stack_ffffffffffffff98);
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)args);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)this,(__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                                *)in_stack_ffffffffffffff98);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator*(&local_38);
    Scope::addMembers(in_stack_00000600,in_stack_000005f8);
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_38);
  }
  for (this_00 = Scope::getFirstMember(&local_20->super_Scope); this_00 != (Symbol *)0x0;
      this_00 = Symbol::getNextSibling(this_00)) {
    symbol = local_8;
    BumpAllocator::emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
              (&this->super_BumpAllocator,local_8);
    Scope::addMember((Scope *)this,symbol);
  }
  return local_20;
}

Assistant:

AnonymousProgramSymbol& AnonymousProgramSymbol::fromSyntax(Scope& scope,
                                                           const AnonymousProgramSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<AnonymousProgramSymbol>(comp, syntax.keyword.location());
    result->setSyntax(syntax);

    for (auto member : syntax.members)
        result->addMembers(*member);

    // All members also get hoisted into the parent scope.
    for (auto member = result->getFirstMember(); member; member = member->getNextSibling())
        scope.addMember(*comp.emplace<TransparentMemberSymbol>(*member));

    return *result;
}